

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::SACSubcaseBase::CheckUniform
          (SACSubcaseBase *this,GLuint prog,GLchar *uniform_name,GLuint uniform_index,
          GLint uniform_type,GLint uniform_size,GLint uniform_offset,GLint uniform_array_stride)

{
  GLchar *pGVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  CallLogWrapper *this_00;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  GLuint uniform_index_local;
  GLchar *uniform_name_local;
  GLint param;
  GLsizei length;
  uint local_6c;
  GLint local_68;
  GLenum type;
  GLint size;
  GLuint index;
  GLchar name [32];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  uniform_index_local = uniform_index;
  uniform_name_local = uniform_name;
  local_6c = uniform_type;
  local_68 = uniform_size;
  glu::CallLogWrapper::glGetUniformIndices(this_00,prog,1,&uniform_name_local,&index);
  bVar6 = index == uniform_index_local;
  if (!bVar6) {
    anon_unknown_0::Output
              ("Uniform: %s: Bad index returned by glGetUniformIndices.\n",uniform_name_local);
  }
  sVar3 = strlen(uniform_name_local);
  glu::CallLogWrapper::glGetProgramResourceName
            (this_00,prog,0x92e1,uniform_index_local,0x20,&length,name);
  iVar4 = (int)sVar3;
  bVar7 = length == iVar4;
  if (!bVar7) {
    anon_unknown_0::Output
              ("Uniform: %s: Length is %d should be %d.\n",uniform_name_local,(ulong)(uint)length,
               sVar3 & 0xffffffff);
  }
  glu::CallLogWrapper::glGetActiveUniform
            (this_00,prog,uniform_index_local,0x20,&length,&size,&type,name);
  pGVar1 = uniform_name_local;
  iVar2 = strcmp(name,uniform_name_local);
  if (iVar2 != 0) {
    anon_unknown_0::Output("Uniform: %s: Bad name returned by glGetActiveUniform.\n",pGVar1);
  }
  if (length != iVar4) {
    anon_unknown_0::Output
              ("Uniform: %s: Length is %d should be %d.\n",uniform_name_local,(ulong)(uint)length,
               sVar3 & 0xffffffff);
  }
  uVar5 = local_6c;
  bVar8 = size == local_6c;
  if (!bVar8) {
    anon_unknown_0::Output
              ("Uniform: %s: Size is %d should be %d.\n",uniform_name_local,(ulong)(uint)size,
               (ulong)local_6c);
  }
  if (type != 0x92db) {
    anon_unknown_0::Output
              ("Uniform: %s: Type is %d should be %d.\n",uniform_name_local,(ulong)type,0x92db);
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a37,&param);
  bVar9 = param == 0x92db;
  if (!bVar9) {
    anon_unknown_0::Output
              ("Uniform: %s: Type is %d should be %d.\n",uniform_name_local,(ulong)(uint)param,
               0x92db);
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a38,&param);
  bVar10 = param == uVar5;
  if (!bVar10) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_SIZE is %d should be %d.\n",uniform_name_local,
               (ulong)(uint)param,(ulong)uVar5);
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a39,&param);
  uVar5 = iVar4 + 1;
  bVar11 = param == uVar5;
  if (!bVar11) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_NAME_LENGTH is %d should be %d.\n",uniform_name_local,
               (ulong)(uint)param,(ulong)uVar5);
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a3a,&param);
  bVar12 = param == -1;
  if (!bVar12) {
    anon_unknown_0::Output("Uniform: %s: GL_UNIFORM_BLOCK_INDEX should be -1.\n",uniform_name_local)
    ;
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a3b,&param);
  bVar13 = param == local_68;
  if (!bVar13) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_OFFSET is %d should be %d.\n",uniform_name_local);
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a3c,&param);
  bVar14 = param == uniform_offset;
  if (!bVar14) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_ARRAY_STRIDE is %d should be %d.\n",uniform_name_local,
               (ulong)(uint)param,(ulong)(uint)uniform_offset);
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a3d,&param);
  bVar15 = param == 0;
  if (!bVar15) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_MATRIX_STRIDE should be 0 is %d.\n",uniform_name_local);
  }
  glu::CallLogWrapper::glGetActiveUniformsiv(this_00,prog,1,&uniform_index_local,0x8a3e,&param);
  if (param != 0) {
    anon_unknown_0::Output
              ("Uniform: %s: GL_UNIFORM_IS_ROW_MAJOR should be 0 is %d.\n",uniform_name_local);
  }
  return param == 0 &&
         (bVar15 &&
         (bVar14 &&
         (bVar13 &&
         (bVar12 &&
         (bVar11 &&
         (bVar10 &&
         (bVar9 && (type == 0x92db &&
                   (bVar8 && (length == iVar4 && (iVar2 == 0 && (bVar7 && bVar6))))))))))));
}

Assistant:

bool CheckUniform(GLuint prog, const GLchar* uniform_name, GLuint uniform_index, GLint uniform_type,
					  GLint uniform_size, GLint uniform_offset, GLint uniform_array_stride)
	{
		bool ok = true;

		GLuint index;
		glGetUniformIndices(prog, 1, &uniform_name, &index);
		if (index != uniform_index)
		{
			Output("Uniform: %s: Bad index returned by glGetUniformIndices.\n", uniform_name);
			ok = false;
		}

		const GLsizei uniform_length = static_cast<GLsizei>(strlen(uniform_name));

		GLsizei length;
		GLint   size;
		GLenum  type;
		GLchar  name[32];

		glGetProgramResourceName(prog, GL_UNIFORM, uniform_index, sizeof(name), &length, name);
		if (length != uniform_length)
		{
			Output("Uniform: %s: Length is %d should be %d.\n", uniform_name, length, uniform_length);
			ok = false;
		}
		glGetActiveUniform(prog, uniform_index, sizeof(name), &length, &size, &type, name);
		if (strcmp(name, uniform_name))
		{
			Output("Uniform: %s: Bad name returned by glGetActiveUniform.\n", uniform_name);
			ok = false;
		}
		if (length != uniform_length)
		{
			Output("Uniform: %s: Length is %d should be %d.\n", uniform_name, length, uniform_length);
			ok = false;
		}
		if (size != uniform_size)
		{
			Output("Uniform: %s: Size is %d should be %d.\n", uniform_name, size, uniform_size);
			ok = false;
		}
		if (type != static_cast<GLenum>(uniform_type))
		{
			Output("Uniform: %s: Type is %d should be %d.\n", uniform_name, type, uniform_type);
			ok = false;
		}

		GLint param;
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_TYPE, &param);
		if (param != uniform_type)
		{
			Output("Uniform: %s: Type is %d should be %d.\n", uniform_name, param, uniform_type);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_SIZE, &param);
		if (param != uniform_size)
		{
			Output("Uniform: %s: GL_UNIFORM_SIZE is %d should be %d.\n", uniform_name, param, uniform_size);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_NAME_LENGTH, &param);
		if (param != (uniform_length + 1))
		{
			Output("Uniform: %s: GL_UNIFORM_NAME_LENGTH is %d should be %d.\n", uniform_name, param,
				   uniform_length + 1);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_BLOCK_INDEX, &param);
		if (param != -1)
		{
			Output("Uniform: %s: GL_UNIFORM_BLOCK_INDEX should be -1.\n", uniform_name);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_OFFSET, &param);
		if (param != uniform_offset)
		{
			Output("Uniform: %s: GL_UNIFORM_OFFSET is %d should be %d.\n", uniform_name, param, uniform_offset);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_ARRAY_STRIDE, &param);
		if (param != uniform_array_stride)
		{
			Output("Uniform: %s: GL_UNIFORM_ARRAY_STRIDE is %d should be %d.\n", uniform_name, param,
				   uniform_array_stride);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_MATRIX_STRIDE, &param);
		if (param != 0)
		{
			Output("Uniform: %s: GL_UNIFORM_MATRIX_STRIDE should be 0 is %d.\n", uniform_name, param);
			ok = false;
		}
		glGetActiveUniformsiv(prog, 1, &uniform_index, GL_UNIFORM_IS_ROW_MAJOR, &param);
		if (param != 0)
		{
			Output("Uniform: %s: GL_UNIFORM_IS_ROW_MAJOR should be 0 is %d.\n", uniform_name, param);
			ok = false;
		}

		return ok;
	}